

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void __thiscall test_ethash_io_memo_file_match::test_method(test_ethash_io_memo_file_match *this)

{
  ethash_h256_t seed_hash;
  ethash_h256_t seedhash;
  ethash_light_t light;
  ethash_full_t full;
  FILE *f;
  ethash_h256_t seed;
  undefined8 **local_190;
  undefined1 local_188;
  undefined8 *local_180;
  undefined ***local_178;
  ethash_io_rc local_16c;
  FILE *local_168;
  undefined **local_160;
  char *local_158;
  shared_count sStack_150;
  char *local_148;
  path local_140;
  ethash_light_t local_120;
  ethash_io_rc local_114;
  char *local_110;
  char *local_108;
  shared_count sStack_100;
  ethash_io_rc *local_f8;
  ethash_io_rc *local_f0;
  ethash_h256_t local_e8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  builtin_memcpy(local_e8.b,"~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~",0x20);
  light = ethash_light_new_internal(0x400,&local_e8);
  seed_hash.b[8] = local_e8.b[8];
  seed_hash.b[9] = local_e8.b[9];
  seed_hash.b[10] = local_e8.b[10];
  seed_hash.b[0xb] = local_e8.b[0xb];
  seed_hash.b[0xc] = local_e8.b[0xc];
  seed_hash.b[0xd] = local_e8.b[0xd];
  seed_hash.b[0xe] = local_e8.b[0xe];
  seed_hash.b[0xf] = local_e8.b[0xf];
  seed_hash.b[0] = local_e8.b[0];
  seed_hash.b[1] = local_e8.b[1];
  seed_hash.b[2] = local_e8.b[2];
  seed_hash.b[3] = local_e8.b[3];
  seed_hash.b[4] = local_e8.b[4];
  seed_hash.b[5] = local_e8.b[5];
  seed_hash.b[6] = local_e8.b[6];
  seed_hash.b[7] = local_e8.b[7];
  seed_hash.b[0x10] = local_e8.b[0x10];
  seed_hash.b[0x11] = local_e8.b[0x11];
  seed_hash.b[0x12] = local_e8.b[0x12];
  seed_hash.b[0x13] = local_e8.b[0x13];
  seed_hash.b[0x14] = local_e8.b[0x14];
  seed_hash.b[0x15] = local_e8.b[0x15];
  seed_hash.b[0x16] = local_e8.b[0x16];
  seed_hash.b[0x17] = local_e8.b[0x17];
  seed_hash.b[0x18] = local_e8.b[0x18];
  seed_hash.b[0x19] = local_e8.b[0x19];
  seed_hash.b[0x1a] = local_e8.b[0x1a];
  seed_hash.b[0x1b] = local_e8.b[0x1b];
  seed_hash.b[0x1c] = local_e8.b[0x1c];
  seed_hash.b[0x1d] = local_e8.b[0x1d];
  seed_hash.b[0x1e] = local_e8.b[0x1e];
  seed_hash.b[0x1f] = local_e8.b[0x1f];
  full = ethash_full_new_internal
                   ("./test_ethash_directory/",seed_hash,0x8000,light,(ethash_callback_t)0x0);
  if (full != (ethash_full_t)0x0) {
    local_50 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_48 = "";
    local_60 = &boost::unit_test::basic_cstring<char_const>::null;
    local_58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_120 = light;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0xfe);
    local_190 = &local_180;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"./test_ethash_directory/","");
    boost::filesystem::detail::status(&local_140,(error_code *)&local_190);
    local_160 = (undefined **)
                CONCAT71(local_160._1_7_,(int)local_140.m_pathname._M_dataplus._M_p == 3);
    local_158 = (char *)0x0;
    sStack_150.pi_ = (sp_counted_base *)0x0;
    local_140.m_pathname.field_2._8_8_ = &local_110;
    local_110 = "fs::is_directory(fs::path(\"./test_ethash_directory/\"))";
    local_108 = "";
    local_140.m_pathname._M_string_length =
         local_140.m_pathname._M_string_length & 0xffffffffffffff00;
    local_140.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013f110;
    local_140.m_pathname.field_2._M_allocated_capacity =
         (size_type)&boost::unit_test::lazy_ostream::inst;
    local_70 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_68 = "";
    boost::test_tools::tt_detail::report_assertion(&local_160,&local_140,&local_70,0xfe,2,0,0);
    boost::detail::shared_count::~shared_count(&sStack_150);
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    ethash_full_delete(full);
    local_80 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_78 = "";
    local_90 = &boost::unit_test::basic_cstring<char_const>::null;
    local_88 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x105);
    local_158 = (char *)((ulong)local_158 & 0xffffffffffffff00);
    local_160 = &PTR__lazy_ostream_0013ea10;
    sStack_150.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
    local_148 = "";
    local_16c = ETHASH_IO_MEMO_MATCH;
    seedhash.b[8] = local_e8.b[8];
    seedhash.b[9] = local_e8.b[9];
    seedhash.b[10] = local_e8.b[10];
    seedhash.b[0xb] = local_e8.b[0xb];
    seedhash.b[0xc] = local_e8.b[0xc];
    seedhash.b[0xd] = local_e8.b[0xd];
    seedhash.b[0xe] = local_e8.b[0xe];
    seedhash.b[0xf] = local_e8.b[0xf];
    seedhash.b[0] = local_e8.b[0];
    seedhash.b[1] = local_e8.b[1];
    seedhash.b[2] = local_e8.b[2];
    seedhash.b[3] = local_e8.b[3];
    seedhash.b[4] = local_e8.b[4];
    seedhash.b[5] = local_e8.b[5];
    seedhash.b[6] = local_e8.b[6];
    seedhash.b[7] = local_e8.b[7];
    seedhash.b[0x10] = local_e8.b[0x10];
    seedhash.b[0x11] = local_e8.b[0x11];
    seedhash.b[0x12] = local_e8.b[0x12];
    seedhash.b[0x13] = local_e8.b[0x13];
    seedhash.b[0x14] = local_e8.b[0x14];
    seedhash.b[0x15] = local_e8.b[0x15];
    seedhash.b[0x16] = local_e8.b[0x16];
    seedhash.b[0x17] = local_e8.b[0x17];
    seedhash.b[0x18] = local_e8.b[0x18];
    seedhash.b[0x19] = local_e8.b[0x19];
    seedhash.b[0x1a] = local_e8.b[0x1a];
    seedhash.b[0x1b] = local_e8.b[0x1b];
    seedhash.b[0x1c] = local_e8.b[0x1c];
    seedhash.b[0x1d] = local_e8.b[0x1d];
    seedhash.b[0x1e] = local_e8.b[0x1e];
    seedhash.b[0x1f] = local_e8.b[0x1f];
    local_114 = ethash_io_prepare("./test_ethash_directory/",seedhash,(FILE **)&local_168,0x8000,
                                  false);
    local_f8 = &local_114;
    local_f0 = &local_16c;
    local_110 = (char *)CONCAT71(local_110._1_7_,local_16c == local_114);
    local_108 = (char *)0x0;
    sStack_100.pi_ = (sp_counted_base *)0x0;
    local_40 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_38 = "";
    local_178 = (undefined ***)&local_f0;
    local_188 = 0;
    local_190 = (undefined8 **)&PTR__lazy_ostream_0013f0d0;
    local_180 = &boost::unit_test::lazy_ostream::inst;
    local_140.m_pathname.field_2._8_8_ = &local_f8;
    local_140.m_pathname._M_string_length =
         local_140.m_pathname._M_string_length & 0xffffffffffffff00;
    local_140.m_pathname._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0013f0d0;
    local_140.m_pathname.field_2._M_allocated_capacity =
         (size_type)&boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion
              (&local_110,&local_160,&local_40,0x105,2,2,2,"ETHASH_IO_MEMO_MATCH",&local_190,
               "ethash_io_prepare(\"./test_ethash_directory/\", seed, &f, full_size, false)",
               &local_140);
    boost::detail::shared_count::~shared_count(&sStack_100);
    local_a0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_98 = "";
    local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x106);
    local_140.m_pathname._M_dataplus._M_p._0_1_ = local_168 != (FILE *)0x0;
    local_140.m_pathname._M_string_length = 0;
    local_140.m_pathname.field_2._M_allocated_capacity = 0;
    local_160 = (undefined **)0x12d53a;
    local_158 = "";
    local_188 = 0;
    local_190 = (undefined8 **)&PTR__lazy_ostream_0013f110;
    local_180 = &boost::unit_test::lazy_ostream::inst;
    local_c0 = "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
    ;
    local_b8 = "";
    local_178 = &local_160;
    boost::test_tools::tt_detail::report_assertion();
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_140.m_pathname.field_2._M_allocated_capacity);
    fclose(local_168);
    ethash_light_delete(local_120);
    local_190 = &local_180;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"./test_ethash_directory/","");
    boost::filesystem::detail::remove_all((path *)&local_190,(error_code *)0x0);
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    return;
  }
  __assert_fail("full",
                "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
                ,0xfc,"void test_ethash_io_memo_file_match::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(test_ethash_io_memo_file_match) {
	uint64_t full_size;
	uint64_t cache_size;
	ethash_h256_t seed;
	ethash_h256_t hash;
	FILE* f;
	memcpy(&seed, "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~", 32);
	memcpy(&hash, "~~~X~~~~~~~~~~~~~~~~~~~~~~~~~~~~", 32);

	cache_size = 1024;
	full_size = 1024 * 32;

	ethash_light_t light = ethash_light_new_internal(cache_size, &seed);
	ethash_full_t full = ethash_full_new_internal(
		"./test_ethash_directory/",
		seed,
		full_size,
		light,
		NULL
	);
	BOOST_ASSERT(full);
	// let's make sure that the directory was created
	BOOST_REQUIRE(fs::is_directory(fs::path("./test_ethash_directory/")));
	// delete the full here so that memory is properly unmapped and FILE handler freed
	ethash_full_delete(full);
	// and check that we have a match when checking again
	BOOST_REQUIRE_EQUAL(
		ETHASH_IO_MEMO_MATCH,
		ethash_io_prepare("./test_ethash_directory/", seed, &f, full_size, false)
	);
	BOOST_REQUIRE(f);

	// cleanup
	fclose(f);
	ethash_light_delete(light);
	fs::remove_all("./test_ethash_directory/");
}